

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_pedersen_blind_commit
              (secp256k1_context *ctx,secp256k1_pedersen_commitment *commit,uchar *blind,
              uchar *value,secp256k1_generator *value_gen,secp256k1_generator *blind_gen)

{
  int iVar1;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_R8;
  long in_R9;
  int ret;
  int overflow2;
  int overflow;
  secp256k1_scalar sec2;
  secp256k1_scalar sec;
  secp256k1_ge r;
  secp256k1_gej rj;
  secp256k1_ge blind_genp;
  secp256k1_ge value_genp;
  secp256k1_ge *in_stack_fffffffffffffde8;
  uint in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  secp256k1_scalar *in_stack_fffffffffffffe00;
  secp256k1_gej *in_stack_fffffffffffffe38;
  secp256k1_ge *in_stack_fffffffffffffe40;
  secp256k1_ge *in_stack_fffffffffffffec0;
  secp256k1_ge *in_stack_fffffffffffffec8;
  secp256k1_scalar *in_stack_fffffffffffffed0;
  secp256k1_scalar *in_stack_fffffffffffffed8;
  secp256k1_gej *in_stack_fffffffffffffee0;
  int local_4;
  
  local_4 = 0;
  if (in_RSI == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)(ulong)in_stack_fffffffffffffdf0,
               (char *)in_stack_fffffffffffffde8);
    local_4 = 0;
  }
  else if (in_RDX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)(ulong)in_stack_fffffffffffffdf0,
               (char *)in_stack_fffffffffffffde8);
    local_4 = 0;
  }
  else if (in_RCX == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)(ulong)in_stack_fffffffffffffdf0,
               (char *)in_stack_fffffffffffffde8);
    local_4 = 0;
  }
  else if (in_R8 == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)(ulong)in_stack_fffffffffffffdf0,
               (char *)in_stack_fffffffffffffde8);
    local_4 = 0;
  }
  else if (in_R9 == 0) {
    secp256k1_callback_call
              ((secp256k1_callback *)(ulong)in_stack_fffffffffffffdf0,
               (char *)in_stack_fffffffffffffde8);
    local_4 = 0;
  }
  else {
    secp256k1_generator_load
              ((secp256k1_ge *)(ulong)in_stack_fffffffffffffdf0,
               (secp256k1_generator *)in_stack_fffffffffffffde8);
    secp256k1_generator_load
              ((secp256k1_ge *)CONCAT44(local_4,in_stack_fffffffffffffdf0),
               (secp256k1_generator *)in_stack_fffffffffffffde8);
    secp256k1_scalar_set_b32
              (in_stack_fffffffffffffe00,
               (uchar *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
               (int *)CONCAT44(local_4,in_stack_fffffffffffffdf0));
    secp256k1_scalar_set_b32
              (in_stack_fffffffffffffe00,
               (uchar *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
               (int *)CONCAT44(local_4,in_stack_fffffffffffffdf0));
    if ((in_stack_fffffffffffffdfc == 0) && (in_stack_fffffffffffffdf8 == 0)) {
      secp256k1_pedersen_blind_ecmult
                (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                 in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
      iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)&stack0xfffffffffffffe98);
      if (iVar1 == 0) {
        secp256k1_ge_set_gej(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        secp256k1_pedersen_commitment_save
                  ((secp256k1_pedersen_commitment *)CONCAT44(local_4,in_stack_fffffffffffffdf0),
                   in_stack_fffffffffffffde8);
        local_4 = 1;
      }
      secp256k1_gej_clear((secp256k1_gej *)0x10ba6d);
      secp256k1_ge_clear((secp256k1_ge *)0x10ba77);
    }
    secp256k1_scalar_clear((secp256k1_scalar *)&stack0xfffffffffffffe20);
  }
  return local_4;
}

Assistant:

int secp256k1_pedersen_blind_commit(const secp256k1_context* ctx, secp256k1_pedersen_commitment *commit, const unsigned char *blind, const unsigned char *value, const secp256k1_generator* value_gen, const secp256k1_generator* blind_gen) {
    secp256k1_ge value_genp;
    secp256k1_ge blind_genp;
    secp256k1_gej rj;
    secp256k1_ge r;
    secp256k1_scalar sec;
    secp256k1_scalar sec2;
    int overflow;
    int overflow2;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(commit != NULL);
    ARG_CHECK(blind != NULL);
    ARG_CHECK(value != NULL);
    ARG_CHECK(value_gen != NULL);
    ARG_CHECK(blind_gen != NULL);
    secp256k1_generator_load(&value_genp, value_gen);
    secp256k1_generator_load(&blind_genp, blind_gen);
    secp256k1_scalar_set_b32(&sec, blind, &overflow);
    secp256k1_scalar_set_b32(&sec2, value, &overflow2);
    if (!overflow && !overflow2) {
        secp256k1_pedersen_blind_ecmult(&rj, &sec, &sec2, &value_genp, &blind_genp);
        if (!secp256k1_gej_is_infinity(&rj)) {
            secp256k1_ge_set_gej(&r, &rj);
            secp256k1_pedersen_commitment_save(commit, &r);
            ret = 1;
        }
        secp256k1_gej_clear(&rj);
        secp256k1_ge_clear(&r);
    }
    secp256k1_scalar_clear(&sec);
    return ret;
}